

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR FILEGetLastErrorFromErrnoAndFilename(LPSTR lpPath)

{
  int *piVar1;
  DWORD local_14;
  LPSTR pCStack_10;
  PAL_ERROR palError;
  LPSTR lpPath_local;
  
  pCStack_10 = lpPath;
  piVar1 = __errno_location();
  if (*piVar1 == 2) {
    FILEGetProperNotFoundError(pCStack_10,&local_14);
  }
  else {
    local_14 = FILEGetLastErrorFromErrno();
  }
  return local_14;
}

Assistant:

PAL_ERROR FILEGetLastErrorFromErrnoAndFilename(LPSTR lpPath)
{
    PAL_ERROR palError;
    if (ENOENT == errno)
    {
        FILEGetProperNotFoundError(lpPath, &palError);
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    return palError;
}